

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  byte *pbVar1;
  int *piVar2;
  byte bVar3;
  ImGuiDockContext *this;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar4;
  ImGuiDockRequest *pIVar5;
  char *pcVar6;
  uint uVar7;
  ImGuiContext *ctx;
  int iVar8;
  uint uVar9;
  ImGuiDockNode *dst_node;
  long lVar10;
  void *__dest;
  char *pcVar11;
  ushort uVar12;
  uint uVar13;
  ushort uVar14;
  void *__src;
  ImGuiDockNode *pIVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  long lVar19;
  ulong __nmemb;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  uint local_78;
  void *pvStack_70;
  ulong local_60;
  
  ctx = GImGui;
  this = GImGui->DockContext;
  uVar9 = 0;
  if (root_id == 0) {
    uVar12 = 0;
    dst_node = (ImGuiDockNode *)0x0;
    uVar14 = 0;
  }
  else {
    dst_node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this->Nodes,root_id);
    if (dst_node == (ImGuiDockNode *)0x0) {
      return;
    }
    uVar12 = *(ushort *)&dst_node->field_0xb0 & 7;
    uVar14 = *(ushort *)&dst_node->field_0xb0 & 0x38;
  }
  local_78 = 0;
  pvStack_70 = (void *)0x0;
  iVar8 = (this->Nodes).Data.Size;
  if (iVar8 < 1) {
    bVar18 = 0;
  }
  else {
    __dest = (void *)0x0;
    __src = (void *)0x0;
    local_60 = 0;
    uVar9 = 0;
    lVar19 = 0;
    bVar18 = 0;
    do {
      src_node = (ImGuiDockNode *)(this->Nodes).Data.Data[lVar19].field_1.val_p;
      if (src_node != (ImGuiDockNode *)0x0) {
        if (root_id == 0) {
          bVar18 = (*(byte *)((long)&src_node->LocalFlags + 1) & 8) >> 3 | bVar18;
LAB_001652ff:
          uVar13 = (uint)local_60;
          if (uVar9 == uVar13) {
            if (uVar13 == 0) {
              uVar9 = 8;
            }
            else {
              uVar9 = ((int)((int)(local_60 >> 0x1f) + uVar13) >> 1) + uVar13;
            }
            uVar7 = uVar13 + 1;
            if ((int)(uVar13 + 1) < (int)uVar9) {
              uVar7 = uVar9;
            }
            local_60 = (ulong)uVar7;
            if (GImGui != (ImGuiContext *)0x0) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + 1;
            }
            __dest = (*GImAllocatorAllocFunc)((long)(int)uVar7 << 3,GImAllocatorUserData);
            uVar9 = uVar13;
            pvStack_70 = __dest;
            if (__src != (void *)0x0) {
              memcpy(__dest,__src,(long)(int)uVar13 << 3);
              if (GImGui != (ImGuiContext *)0x0) {
                piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + -1;
              }
              (*GImAllocatorFreeFunc)(__src,GImAllocatorUserData);
              uVar9 = local_78;
            }
          }
          *(ImGuiDockNode **)((long)__dest + (long)(int)uVar9 * 8) = src_node;
          uVar9 = local_78 + 1;
          iVar8 = (this->Nodes).Data.Size;
          __src = __dest;
          local_78 = uVar9;
        }
        else {
          pIVar4 = src_node;
          if (src_node->ID != root_id) {
            do {
              pIVar15 = pIVar4;
              pIVar4 = pIVar15->ParentNode;
            } while (pIVar4 != (ImGuiDockNode *)0x0);
            if (pIVar15->ID == root_id) {
              bVar3 = *(byte *)((long)&src_node->LocalFlags + 1);
              lVar10 = (long)(ctx->DockContext->Requests).Size;
              if (0 < lVar10) {
                pIVar5 = (ctx->DockContext->Requests).Data;
                lVar16 = 0;
                do {
                  if (*(ImGuiDockNode **)((long)&pIVar5->DockTargetNode + lVar16) == src_node) {
                    *(undefined4 *)((long)&pIVar5->Type + lVar16) = 0;
                  }
                  lVar16 = lVar16 + 0x40;
                } while (lVar10 * 0x40 != lVar16);
              }
              bVar18 = (bVar3 & 8) >> 3 | bVar18;
              if (root_id != 0) {
                DockNodeMoveWindows(dst_node,src_node);
              }
              goto LAB_001652ff;
            }
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar8);
  }
  if (root_id != 0) {
    *(ushort *)&dst_node->field_0xb0 =
         uVar14 | uVar12 | (ushort)*(undefined4 *)&dst_node->field_0xb0 & 0xffc0;
  }
  pcVar6 = (ctx->SettingsWindows).Buf.Data;
  __nmemb = (ulong)uVar9;
  if (pcVar6 != (char *)0x0) {
    iVar8 = (ctx->SettingsWindows).Buf.Size;
    pcVar11 = pcVar6 + 4;
    do {
      if ((*(int *)(pcVar11 + 0x14) != 0) && (0 < (int)uVar9)) {
        uVar17 = 0;
        do {
          if (**(int **)((long)pvStack_70 + uVar17 * 8) == *(int *)(pcVar11 + 0x14)) {
            *(ImGuiID *)(pcVar11 + 0x14) = root_id;
            break;
          }
          uVar17 = uVar17 + 1;
        } while (__nmemb != uVar17);
      }
      pcVar11 = pcVar11 + *(int *)(pcVar11 + -4);
    } while (pcVar11 != pcVar6 + (long)iVar8 + 4);
  }
  if ((int)uVar9 < 2) {
    if (uVar9 != 1) goto LAB_001654b6;
  }
  else {
    qsort(pvStack_70,__nmemb,8,DockNodeComparerDepthMostFirst);
  }
  uVar17 = 0;
  do {
    DockContextRemoveNode(ctx,*(ImGuiDockNode **)((long)pvStack_70 + uVar17 * 8),false);
    uVar17 = uVar17 + 1;
  } while (uVar17 < __nmemb);
LAB_001654b6:
  if (root_id == 0) {
    ImGuiStorage::Clear(&this->Nodes);
    pIVar5 = (this->Requests).Data;
    if (pIVar5 != (ImGuiDockRequest *)0x0) {
      (this->Requests).Size = 0;
      (this->Requests).Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (this->Requests).Data = (ImGuiDockRequest *)0x0;
    }
  }
  else if (bVar18 != 0) {
    pbVar1 = (byte *)((long)&dst_node->LocalFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    dst_node->CentralNode = dst_node;
  }
  if (pvStack_70 != (void *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(pvStack_70,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc = ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}